

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

int localvar_explist(LexState *ls,expdesc *v,ravi_type_map *vars,TString **usertypes,int nvars)

{
  int n;
  
  subexpr(ls,v,0);
  ravi_typecheck(ls,v,vars,usertypes,nvars,0);
  n = 1;
  while ((ls->t).token == 0x2c) {
    luaX_next(ls);
    luaK_exp2nextreg(ls->fs,v);
    subexpr(ls,v,0);
    ravi_typecheck(ls,v,vars,usertypes,nvars,n);
    n = n + 1;
  }
  return n;
}

Assistant:

static int localvar_explist(LexState *ls, expdesc *v, ravi_type_map *vars, TString** usertypes, int nvars) {
  /* explist -> expr { ',' expr } */
  int n = 1;  /* at least one expression */
  expr(ls, v);
  ravi_typecheck(ls, v, vars, usertypes, nvars, 0);
  while (testnext(ls, ',')) {
    luaK_exp2nextreg(ls->fs, v);
    expr(ls, v);
    ravi_typecheck(ls, v, vars, usertypes, nvars, n);
    n++;
  }
  return n;
}